

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case2457(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1c2;
  allocator<char> local_1c1;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1c0;
  string local_1a8;
  SyntaxKind local_188 [8];
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"for ( x y ; 1 ; ) { }",&local_1c1);
  Expectation::Expectation(&local_178);
  local_188[0] = ForStatement;
  local_188[1] = DeclarationStatement;
  local_188[2] = VariableAndOrFunctionDeclaration;
  local_188[3] = TypedefName;
  local_188[4] = IdentifierDeclarator;
  local_188[5] = IntegerConstantExpression;
  local_188[6] = 0x469;
  __l._M_len = 7;
  __l._M_array = local_188;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1c0,__l,
             &local_1c2);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1c0);
  Expectation::Expectation(&local_c0,pEVar1);
  parseStatement(this,&local_1a8,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1c0);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

void ParserTester::case2457()
{
    parseStatement("for ( x y ; 1 ; ) { }",
                   Expectation().AST( { SyntaxKind::ForStatement,
                                        SyntaxKind::DeclarationStatement,
                                        SyntaxKind::VariableAndOrFunctionDeclaration,
                                        SyntaxKind::TypedefName,
                                        SyntaxKind::IdentifierDeclarator,
                                        SyntaxKind::IntegerConstantExpression,
                                        SyntaxKind::CompoundStatement }));
}